

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsdl-attr.cpp
# Opt level: O0

void __thiscall yactfr::internal::TsdlAttr::throwUnknown(TsdlAttr *this)

{
  TextLocation loc;
  ostream *poVar1;
  TextLocation local_1d0;
  string local_1b8;
  ostringstream local_188 [8];
  ostringstream ss;
  TsdlAttr *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_188);
  poVar1 = std::operator<<((ostream *)local_188,"Unknown attribute `");
  poVar1 = std::operator<<(poVar1,(string *)&this->name);
  std::operator<<(poVar1,"`.");
  std::__cxx11::ostringstream::str();
  nameTextLoc(&local_1d0,this);
  loc._lineNumber = local_1d0._lineNumber;
  loc._offset = local_1d0._offset;
  loc._colNumber = local_1d0._colNumber;
  throwTextParseError(&local_1b8,loc);
}

Assistant:

void TsdlAttr::throwUnknown() const
{
    std::ostringstream ss;

    ss << "Unknown attribute `" << name << "`.";
    throwTextParseError(ss.str(), this->nameTextLoc());
}